

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

function<void_(TcpSocket_*)> * __thiscall
SslTcpSocketImpl::BindFuncConEstablished
          (function<void_(TcpSocket_*)> *__return_storage_ptr__,SslTcpSocketImpl *this,
          function<void_(TcpSocket_*)> *fClientConnected)

{
  std::function<void_(TcpSocket_*)>::swap(&this->m_fClientConnected,fClientConnected);
  std::function<void_(TcpSocket_*)>::function(__return_storage_ptr__,fClientConnected);
  return __return_storage_ptr__;
}

Assistant:

function<void(TcpSocket*)> SslTcpSocketImpl::BindFuncConEstablished(function<void(TcpSocket*)> fClientConnected) noexcept
{
    m_fClientConnected.swap(fClientConnected);
    return fClientConnected;
}